

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

Test * __thiscall
testing::internal::ParameterizedTestFactory<(anonymous_namespace)::SatdLpTest_MinValue_Test>::
CreateTest(ParameterizedTestFactory<(anonymous_namespace)::SatdLpTest_MinValue_Test> *this)

{
  Test *this_00;
  
  WithParamInterface<(anonymous_namespace)::SatdTestParam<int(*)(short_const*,int)>>::parameter_ =
       &this->parameter_;
  this_00 = (Test *)operator_new(0x40);
  anon_unknown.dwarf_171beb8::SatdLpTest::SatdLpTest((SatdLpTest *)this_00);
  (((SatdTestBase<short,_int_(*)(const_short_*,_int)> *)&this_00->_vptr_Test)->super_Test).
  _vptr_Test = (_func_int **)&PTR__SatdTestBase_00f45e88;
  this_00[1]._vptr_Test = (_func_int **)&PTR__SatdLpTest_MinValue_Test_00f45ec8;
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }